

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

void __thiscall FBaseCVar::CmdSet(FBaseCVar *this,char *newval)

{
  uint32 uVar1;
  char *pcVar2;
  UCVarValue val;
  char *newval_local;
  FBaseCVar *this_local;
  
  SetGenericRep(this,(UCVarValue)newval,CVAR_String);
  uVar1 = GetFlags(this);
  if ((uVar1 & 8) == 0) {
    uVar1 = GetFlags(this);
    if ((uVar1 & 0x10) != 0) {
      pcVar2 = GetName(this);
      Printf("%s will be changed for next game.\n",pcVar2);
    }
  }
  else {
    pcVar2 = GetName(this);
    Printf("%s is write protected.\n",pcVar2);
  }
  return;
}

Assistant:

void FBaseCVar::CmdSet (const char *newval)
{
	UCVarValue val;

	// Casting away the const is safe in this case.
	val.String = const_cast<char *>(newval);        
	SetGenericRep (val, CVAR_String);

	if (GetFlags() & CVAR_NOSET)
		Printf ("%s is write protected.\n", GetName());
	else if (GetFlags() & CVAR_LATCH)
		Printf ("%s will be changed for next game.\n", GetName());
}